

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void block_move(c2m_ctx_t c2m_ctx,op_t var,op_t val,mir_size_t size)

{
  op_t oVar1;
  op_t oVar2;
  gen_ctx_conflict *pgVar3;
  MIR_context_t ctx_00;
  MIR_op_t op1;
  MIR_op_t op1_00;
  MIR_op_t op2;
  MIR_op_t op2_00;
  MIR_op_t op2_01;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  MIR_op_t op1_01;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  MIR_op_t op2_02;
  MIR_op_t op1_02;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined7 uVar14;
  undefined6 uVar15;
  undefined6 uVar16;
  int64_t iVar17;
  int64_t iVar18;
  int iVar19;
  MIR_insn_t_conflict insn;
  undefined1 auVar20 [64];
  MIR_op_t local_1d8;
  op_t local_1a8;
  op_t local_168;
  MIR_op_t local_128;
  op_t local_f8;
  op_t local_b8;
  undefined1 auStack_78 [8];
  op_t index;
  MIR_label_t repeat_label;
  MIR_context_t ctx;
  gen_ctx_t_conflict gen_ctx;
  mir_size_t size_local;
  c2m_ctx_t c2m_ctx_local;
  
  pgVar3 = c2m_ctx->gen_ctx;
  ctx_00 = c2m_ctx->ctx;
  uVar15 = var.mir_op._10_6_;
  uVar11 = var.mir_op.u.mem.alias;
  var.mir_op._8_8_ = var.mir_op._8_8_;
  uVar9 = var.mir_op._8_8_;
  var.mir_op.u.i = var.mir_op.u._0_8_;
  uVar16 = val.mir_op._10_6_;
  uVar14 = val.mir_op.u.i._1_7_;
  val.mir_op._8_8_ = val.mir_op._8_8_;
  uVar10 = val.mir_op._8_8_;
  val.mir_op.u.i = val.mir_op.u._0_8_;
  iVar17 = var.mir_op.u.i;
  var.mir_op._10_6_ = uVar15;
  var.mir_op.u.mem.alias = uVar11;
  iVar18 = val.mir_op.u.i;
  val.mir_op._10_6_ = uVar16;
  val.mir_op.u.i._1_7_ = uVar14;
  iVar19 = MIR_op_eq_p(ctx_00,var.mir_op,val.mir_op);
  uVar13 = val.mir_op.u.i;
  uVar12 = val.mir_op._8_8_;
  uVar10 = var.mir_op.u.i;
  uVar9 = var.mir_op._8_8_;
  if ((iVar19 == 0) && (size != 0)) {
    var.mir_op.u.i = uVar10;
    val.mir_op.u.i = uVar13;
    var.mir_op._8_8_ = uVar9;
    val.mir_op._8_8_ = uVar12;
    if (size < 6) {
      uVar15 = var.mir_op._10_6_;
      uVar11 = var.mir_op.u.mem.alias;
      uVar9 = var.mir_op._8_8_;
      uVar16 = val.mir_op._10_6_;
      uVar14 = val.mir_op.u.i._1_7_;
      uVar10 = val.mir_op._8_8_;
      uVar12 = var.mir_op.u.i;
      var.mir_op._10_6_ = uVar15;
      var.mir_op.u.mem.alias = uVar11;
      uVar13 = val.mir_op.u.i;
      val.mir_op._10_6_ = uVar16;
      val.mir_op.u.i._1_7_ = uVar14;
      insn = MIR_new_label(ctx_00);
      uVar13 = val.mir_op.u.i;
      uVar12 = val.mir_op._8_8_;
      uVar10 = var.mir_op.u.i;
      uVar9 = var.mir_op._8_8_;
      uVar15 = var.mir_op._10_6_;
      uVar11 = var.mir_op.u.mem.alias;
      var.mir_op._8_8_ = uVar9;
      uVar9 = var.mir_op._8_8_;
      var.mir_op.u.i = uVar10;
      uVar16 = val.mir_op._10_6_;
      uVar14 = val.mir_op.u.i._1_7_;
      val.mir_op._8_8_ = uVar12;
      uVar10 = val.mir_op._8_8_;
      val.mir_op.u.i = uVar13;
      uVar12 = var.mir_op.u.i;
      var.mir_op._10_6_ = uVar15;
      var.mir_op.u.mem.alias = uVar11;
      uVar13 = val.mir_op.u.i;
      val.mir_op._10_6_ = uVar16;
      val.mir_op.u.i._1_7_ = uVar14;
      get_new_temp(&local_f8,c2m_ctx,MIR_T_I64);
      uVar13 = val.mir_op.u.i;
      uVar12 = val.mir_op._8_8_;
      uVar10 = var.mir_op.u.i;
      uVar9 = var.mir_op._8_8_;
      uVar15 = var.mir_op._10_6_;
      uVar11 = var.mir_op.u.mem.alias;
      var.mir_op._8_8_ = uVar9;
      uVar9 = var.mir_op._8_8_;
      var.mir_op.u.i = uVar10;
      uVar16 = val.mir_op._10_6_;
      uVar14 = val.mir_op.u.i._1_7_;
      val.mir_op._8_8_ = uVar12;
      uVar10 = val.mir_op._8_8_;
      val.mir_op.u.i = uVar13;
      uVar12 = var.mir_op.u.i;
      var.mir_op._10_6_ = uVar15;
      var.mir_op.u.mem.alias = uVar11;
      uVar13 = val.mir_op.u.i;
      val.mir_op._10_6_ = uVar16;
      val.mir_op.u.i._1_7_ = uVar14;
      memcpy(auStack_78,&local_f8,0x40);
      uVar13 = val.mir_op.u.i;
      uVar12 = val.mir_op._8_8_;
      uVar10 = var.mir_op.u.i;
      uVar9 = var.mir_op._8_8_;
      uVar15 = var.mir_op._10_6_;
      uVar11 = var.mir_op.u.mem.alias;
      var.mir_op._8_8_ = uVar9;
      uVar9 = var.mir_op._8_8_;
      var.mir_op.u.i = uVar10;
      uVar16 = val.mir_op._10_6_;
      uVar14 = val.mir_op.u.i._1_7_;
      val.mir_op._8_8_ = uVar12;
      uVar10 = val.mir_op._8_8_;
      val.mir_op.u.i = uVar13;
      uVar12 = var.mir_op.u.i;
      var.mir_op._10_6_ = uVar15;
      var.mir_op.u.mem.alias = uVar11;
      uVar13 = val.mir_op.u.i;
      val.mir_op._10_6_ = uVar16;
      val.mir_op.u.i._1_7_ = uVar14;
      MIR_new_int_op(&local_128,ctx_00,size);
      uVar13 = val.mir_op.u.i;
      uVar12 = val.mir_op._8_8_;
      uVar10 = var.mir_op.u.i;
      uVar9 = var.mir_op._8_8_;
      op1_02._8_8_ = index.mir_op.data;
      op1_02.data = (void *)index._8_8_;
      op1_02.u.i = index.mir_op._8_8_;
      op1_02.u._8_8_ = index.mir_op.u.i;
      op1_02.u._16_8_ = index.mir_op.u.str.s;
      op1_02.u.mem.disp = index.mir_op.u._16_8_;
      op2._8_8_ = local_128._8_8_;
      op2.data = local_128.data;
      op2.u.i = local_128.u.i;
      op2.u.str.s = local_128.u.str.s;
      op2.u._16_8_ = local_128.u._16_8_;
      op2.u.mem.disp = local_128.u.mem.disp;
      uVar15 = var.mir_op._10_6_;
      uVar11 = var.mir_op.u.mem.alias;
      var.mir_op._8_8_ = uVar9;
      uVar9 = var.mir_op._8_8_;
      var.mir_op.u.i = uVar10;
      uVar16 = val.mir_op._10_6_;
      uVar14 = val.mir_op.u.i._1_7_;
      val.mir_op._8_8_ = uVar12;
      uVar10 = val.mir_op._8_8_;
      val.mir_op.u.i = uVar13;
      uVar12 = var.mir_op.u.i;
      var.mir_op._10_6_ = uVar15;
      var.mir_op.u.mem.alias = uVar11;
      uVar13 = val.mir_op.u.i;
      val.mir_op._10_6_ = uVar16;
      val.mir_op.u.i._1_7_ = uVar14;
      emit2(c2m_ctx,MIR_MOV,op1_02,op2);
      uVar13 = val.mir_op.u.i;
      uVar12 = val.mir_op._8_8_;
      uVar10 = var.mir_op.u.i;
      uVar9 = var.mir_op._8_8_;
      auVar20._16_8_ = index._8_8_;
      auVar20._0_16_ = _auStack_78;
      auVar20._24_8_ = index.mir_op.data;
      auVar20._32_8_ = index.mir_op._8_8_;
      auVar20._40_8_ = index.mir_op.u.i;
      auVar20._48_8_ = index.mir_op.u.str.s;
      auVar20._56_8_ = index.mir_op.u._16_8_;
      auVar20 = vmovdqu64_avx512f(auVar20);
      oVar1 = (op_t)vmovdqu64_avx512f(auVar20);
      auVar8._16_8_ = val.mir_op.data;
      auVar8._0_16_ = (undefined1  [16])val._0_16_;
      auVar8._24_8_ = uVar12;
      auVar8._26_6_ = val.mir_op._10_6_;
      auVar8._32_8_ = uVar13;
      auVar8._33_7_ = val.mir_op.u.i._1_7_;
      auVar8._40_8_ = val.mir_op.u.str.s;
      auVar8._48_8_ = val.mir_op.u._16_8_;
      auVar8._56_8_ = val.mir_op.u.mem.disp;
      auVar20 = vmovdqu64_avx512f(auVar8);
      oVar2 = (op_t)vmovdqu64_avx512f(auVar20);
      uVar15 = var.mir_op._10_6_;
      uVar11 = var.mir_op.u.mem.alias;
      var.mir_op._8_8_ = uVar9;
      uVar9 = var.mir_op._8_8_;
      var.mir_op.u.i = uVar10;
      uVar16 = val.mir_op._10_6_;
      uVar14 = val.mir_op.u.i._1_7_;
      val.mir_op._8_8_ = uVar12;
      uVar10 = val.mir_op._8_8_;
      val.mir_op.u.i = uVar13;
      uVar12 = var.mir_op.u.i;
      var.mir_op._10_6_ = uVar15;
      var.mir_op.u.mem.alias = uVar11;
      uVar13 = val.mir_op.u.i;
      val.mir_op._10_6_ = uVar16;
      val.mir_op.u.i._1_7_ = uVar14;
      modify_for_block_move(&local_168,c2m_ctx,oVar2,oVar1);
      uVar13 = val.mir_op.u.i;
      uVar12 = val.mir_op._8_8_;
      uVar10 = var.mir_op.u.i;
      uVar9 = var.mir_op._8_8_;
      uVar15 = var.mir_op._10_6_;
      uVar11 = var.mir_op.u.mem.alias;
      var.mir_op._8_8_ = uVar9;
      uVar9 = var.mir_op._8_8_;
      var.mir_op.u.i = uVar10;
      uVar16 = val.mir_op._10_6_;
      uVar14 = val.mir_op.u.i._1_7_;
      val.mir_op._8_8_ = uVar12;
      uVar10 = val.mir_op._8_8_;
      val.mir_op.u.i = uVar13;
      uVar12 = var.mir_op.u.i;
      var.mir_op._10_6_ = uVar15;
      var.mir_op.u.mem.alias = uVar11;
      uVar13 = val.mir_op.u.i;
      val.mir_op._10_6_ = uVar16;
      val.mir_op.u.i._1_7_ = uVar14;
      memcpy(&val,&local_168,0x40);
      uVar13 = val.mir_op.u.i;
      uVar12 = val.mir_op._8_8_;
      uVar10 = var.mir_op.u.i;
      uVar9 = var.mir_op._8_8_;
      auVar4._16_8_ = index._8_8_;
      auVar4._0_16_ = _auStack_78;
      auVar4._24_8_ = index.mir_op.data;
      auVar4._32_8_ = index.mir_op._8_8_;
      auVar4._40_8_ = index.mir_op.u.i;
      auVar4._48_8_ = index.mir_op.u.str.s;
      auVar4._56_8_ = index.mir_op.u._16_8_;
      auVar20 = vmovdqu64_avx512f(auVar4);
      oVar1 = (op_t)vmovdqu64_avx512f(auVar20);
      auVar6._16_8_ = var.mir_op.data;
      auVar6._0_16_ = (undefined1  [16])var._0_16_;
      auVar6._24_8_ = uVar9;
      auVar6._26_6_ = var.mir_op._10_6_;
      auVar6._32_8_ = uVar10;
      auVar6._36_4_ = var.mir_op.u.mem.alias;
      auVar6._40_8_ = var.mir_op.u.str.s;
      auVar6._48_8_ = var.mir_op.u._16_8_;
      auVar6._56_8_ = var.mir_op.u.mem.disp;
      auVar20 = vmovdqu64_avx512f(auVar6);
      oVar2 = (op_t)vmovdqu64_avx512f(auVar20);
      uVar15 = var.mir_op._10_6_;
      uVar11 = var.mir_op.u.mem.alias;
      var.mir_op._8_8_ = uVar9;
      uVar9 = var.mir_op._8_8_;
      var.mir_op.u.i = uVar10;
      uVar16 = val.mir_op._10_6_;
      uVar14 = val.mir_op.u.i._1_7_;
      val.mir_op._8_8_ = uVar12;
      uVar10 = val.mir_op._8_8_;
      val.mir_op.u.i = uVar13;
      uVar12 = var.mir_op.u.i;
      var.mir_op._10_6_ = uVar15;
      var.mir_op.u.mem.alias = uVar11;
      uVar13 = val.mir_op.u.i;
      val.mir_op._10_6_ = uVar16;
      val.mir_op.u.i._1_7_ = uVar14;
      modify_for_block_move(&local_1a8,c2m_ctx,oVar2,oVar1);
      uVar13 = val.mir_op.u.i;
      uVar12 = val.mir_op._8_8_;
      uVar10 = var.mir_op.u.i;
      uVar9 = var.mir_op._8_8_;
      uVar15 = var.mir_op._10_6_;
      uVar11 = var.mir_op.u.mem.alias;
      var.mir_op._8_8_ = uVar9;
      uVar9 = var.mir_op._8_8_;
      var.mir_op.u.i = uVar10;
      uVar16 = val.mir_op._10_6_;
      uVar14 = val.mir_op.u.i._1_7_;
      val.mir_op._8_8_ = uVar12;
      uVar10 = val.mir_op._8_8_;
      val.mir_op.u.i = uVar13;
      uVar12 = var.mir_op.u.i;
      var.mir_op._10_6_ = uVar15;
      var.mir_op.u.mem.alias = uVar11;
      uVar13 = val.mir_op.u.i;
      val.mir_op._10_6_ = uVar16;
      val.mir_op.u.i._1_7_ = uVar14;
      memcpy(&var,&local_1a8,0x40);
      uVar13 = val.mir_op.u.i;
      uVar12 = val.mir_op._8_8_;
      uVar10 = var.mir_op.u.i;
      uVar9 = var.mir_op._8_8_;
      uVar15 = var.mir_op._10_6_;
      uVar11 = var.mir_op.u.mem.alias;
      var.mir_op._8_8_ = uVar9;
      uVar9 = var.mir_op._8_8_;
      var.mir_op.u.i = uVar10;
      uVar16 = val.mir_op._10_6_;
      uVar14 = val.mir_op.u.i._1_7_;
      val.mir_op._8_8_ = uVar12;
      uVar10 = val.mir_op._8_8_;
      val.mir_op.u.i = uVar13;
      uVar12 = var.mir_op.u.i;
      var.mir_op._10_6_ = uVar15;
      var.mir_op.u.mem.alias = uVar11;
      uVar13 = val.mir_op.u.i;
      val.mir_op._10_6_ = uVar16;
      val.mir_op.u.i._1_7_ = uVar14;
      emit_label_insn_opt(c2m_ctx,insn);
      uVar13 = val.mir_op.u.i;
      uVar12 = val.mir_op._8_8_;
      uVar10 = var.mir_op.u.i;
      uVar9 = var.mir_op._8_8_;
      op1._8_8_ = index.mir_op.data;
      op1.data = (void *)index._8_8_;
      op1.u.i = index.mir_op._8_8_;
      op1.u._8_8_ = index.mir_op.u.i;
      op1.u._16_8_ = index.mir_op.u.str.s;
      op1.u.mem.disp = index.mir_op.u._16_8_;
      op2_00._8_8_ = index.mir_op.data;
      op2_00.data = (void *)index._8_8_;
      op2_00.u.i = index.mir_op._8_8_;
      op2_00.u._8_8_ = index.mir_op.u.i;
      op2_00.u._16_8_ = index.mir_op.u.str.s;
      op2_00.u.mem.disp = index.mir_op.u._16_8_;
      uVar15 = var.mir_op._10_6_;
      uVar11 = var.mir_op.u.mem.alias;
      var.mir_op._8_8_ = uVar9;
      uVar9 = var.mir_op._8_8_;
      var.mir_op.u.i = uVar10;
      uVar16 = val.mir_op._10_6_;
      uVar14 = val.mir_op.u.i._1_7_;
      val.mir_op._8_8_ = uVar12;
      uVar10 = val.mir_op._8_8_;
      val.mir_op.u.i = uVar13;
      uVar12 = var.mir_op.u.i;
      var.mir_op._10_6_ = uVar15;
      var.mir_op.u.mem.alias = uVar11;
      uVar13 = val.mir_op.u.i;
      val.mir_op._10_6_ = uVar16;
      val.mir_op.u.i._1_7_ = uVar14;
      emit3(c2m_ctx,MIR_SUB,op1,op2_00,(pgVar3->one_op).mir_op);
      uVar14 = val.mir_op.u.i._1_7_;
      uVar13 = val.mir_op.u.i;
      uVar12 = val.mir_op._8_8_;
      uVar11 = var.mir_op.u.mem.alias;
      uVar10 = var.mir_op.u.i;
      uVar9 = var.mir_op._8_8_;
      var.mir_op.u.i = uVar10;
      val.mir_op.u.i = uVar13;
      var.mir_op._8_8_ = uVar9;
      val.mir_op._8_8_ = uVar12;
      if (((uVar9 & 0xff) != 10) || ((uVar12 & 0xff) != 10)) {
        uVar15 = var.mir_op._10_6_;
        uVar9 = var.mir_op._8_8_;
        uVar16 = val.mir_op._10_6_;
        uVar10 = val.mir_op._8_8_;
        uVar12 = var.mir_op.u.i;
        var.mir_op._10_6_ = uVar15;
        var.mir_op.u.mem.alias = uVar11;
        uVar13 = val.mir_op.u.i;
        val.mir_op._10_6_ = uVar16;
        val.mir_op.u.i._1_7_ = uVar14;
        __assert_fail("var.mir_op.mode == MIR_OP_MEM && val.mir_op.mode == MIR_OP_MEM",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2b31,"void block_move(c2m_ctx_t, op_t, op_t, mir_size_t)");
      }
      var.mir_op.u.reg._0_1_ = 0;
      val.mir_op.u.reg._0_1_ = 0;
      op2_02._8_8_ = uVar12;
      op2_02.data = val.mir_op.data;
      op2_02._10_6_ = val.mir_op._10_6_;
      op2_02.u.reg._0_1_ = 0;
      op2_02.u.i._1_7_ = uVar14;
      op2_02.u.str.s = val.mir_op.u.str.s;
      op2_02.u._16_8_ = val.mir_op.u._16_8_;
      op2_02.u.mem.disp = val.mir_op.u.mem.disp;
      op1_01._8_8_ = uVar9;
      op1_01.data = var.mir_op.data;
      op1_01._10_6_ = var.mir_op._10_6_;
      op1_01.u.i = var.mir_op.u.i;
      op1_01.u.mem.alias = uVar11;
      op1_01.u.str.s = var.mir_op.u.str.s;
      op1_01.u._16_8_ = var.mir_op.u._16_8_;
      op1_01.u.mem.disp = var.mir_op.u.mem.disp;
      uVar15 = var.mir_op._10_6_;
      uVar16 = val.mir_op._10_6_;
      uVar9 = var.mir_op._8_8_;
      uVar10 = var.mir_op.u.i;
      var.mir_op._10_6_ = uVar15;
      var.mir_op.u.mem.alias = uVar11;
      uVar12 = val.mir_op._8_8_;
      uVar13 = val.mir_op.u.i;
      val.mir_op._10_6_ = uVar16;
      val.mir_op.u.i._1_7_ = uVar14;
      emit2(c2m_ctx,MIR_MOV,op1_01,op2_02);
      uVar13 = val.mir_op.u.i;
      uVar12 = val.mir_op._8_8_;
      uVar10 = var.mir_op.u.i;
      uVar9 = var.mir_op._8_8_;
      uVar15 = var.mir_op._10_6_;
      uVar11 = var.mir_op.u.mem.alias;
      var.mir_op._8_8_ = uVar9;
      uVar9 = var.mir_op._8_8_;
      var.mir_op.u.i = uVar10;
      uVar16 = val.mir_op._10_6_;
      uVar14 = val.mir_op.u.i._1_7_;
      val.mir_op._8_8_ = uVar12;
      uVar10 = val.mir_op._8_8_;
      val.mir_op.u.i = uVar13;
      uVar12 = var.mir_op.u.i;
      var.mir_op._10_6_ = uVar15;
      var.mir_op.u.mem.alias = uVar11;
      uVar13 = val.mir_op.u.i;
      val.mir_op._10_6_ = uVar16;
      val.mir_op.u.i._1_7_ = uVar14;
      MIR_new_label_op(&local_1d8,ctx_00,insn);
      uVar13 = val.mir_op.u.i;
      uVar12 = val.mir_op._8_8_;
      uVar10 = var.mir_op.u.i;
      uVar9 = var.mir_op._8_8_;
      op1_00._8_8_ = local_1d8._8_8_;
      op1_00.data = local_1d8.data;
      op1_00.u.i = local_1d8.u.i;
      op1_00.u.str.s = local_1d8.u.str.s;
      op1_00.u._16_8_ = local_1d8.u._16_8_;
      op1_00.u.mem.disp = local_1d8.u.mem.disp;
      op2_01._8_8_ = index.mir_op.data;
      op2_01.data = (void *)index._8_8_;
      op2_01.u.i = index.mir_op._8_8_;
      op2_01.u._8_8_ = index.mir_op.u.i;
      op2_01.u._16_8_ = index.mir_op.u.str.s;
      op2_01.u.mem.disp = index.mir_op.u._16_8_;
      uVar15 = var.mir_op._10_6_;
      uVar11 = var.mir_op.u.mem.alias;
      var.mir_op._8_8_ = uVar9;
      uVar9 = var.mir_op._8_8_;
      var.mir_op.u.i = uVar10;
      uVar16 = val.mir_op._10_6_;
      uVar14 = val.mir_op.u.i._1_7_;
      val.mir_op._8_8_ = uVar12;
      uVar10 = val.mir_op._8_8_;
      val.mir_op.u.i = uVar13;
      uVar12 = var.mir_op.u.i;
      var.mir_op._10_6_ = uVar15;
      var.mir_op.u.mem.alias = uVar11;
      uVar13 = val.mir_op.u.i;
      val.mir_op._10_6_ = uVar16;
      val.mir_op.u.i._1_7_ = uVar14;
      emit3(c2m_ctx,MIR_BGT,op1_00,op2_01,(pgVar3->zero_op).mir_op);
    }
    else {
      auVar5._16_8_ = var.mir_op.data;
      auVar5._0_16_ = (undefined1  [16])var._0_16_;
      auVar5._24_8_ = uVar9;
      auVar5._26_6_ = var.mir_op._10_6_;
      auVar5._32_8_ = uVar10;
      auVar5._36_4_ = var.mir_op.u.mem.alias;
      auVar5._40_8_ = var.mir_op.u.str.s;
      auVar5._48_8_ = var.mir_op.u._16_8_;
      auVar5._56_8_ = var.mir_op.u.mem.disp;
      auVar20 = vmovdqu64_avx512f(auVar5);
      oVar1 = (op_t)vmovdqu64_avx512f(auVar20);
      uVar15 = var.mir_op._10_6_;
      uVar11 = var.mir_op.u.mem.alias;
      uVar9 = var.mir_op._8_8_;
      uVar16 = val.mir_op._10_6_;
      uVar14 = val.mir_op.u.i._1_7_;
      uVar10 = val.mir_op._8_8_;
      uVar12 = var.mir_op.u.i;
      var.mir_op._10_6_ = uVar15;
      var.mir_op.u.mem.alias = uVar11;
      uVar13 = val.mir_op.u.i;
      val.mir_op._10_6_ = uVar16;
      val.mir_op.u.i._1_7_ = uVar14;
      mem_to_address(&local_b8,c2m_ctx,oVar1,1);
      uVar13 = val.mir_op.u.i;
      uVar12 = val.mir_op._8_8_;
      uVar10 = var.mir_op.u.i;
      uVar9 = var.mir_op._8_8_;
      uVar15 = var.mir_op._10_6_;
      uVar11 = var.mir_op.u.mem.alias;
      var.mir_op._8_8_ = uVar9;
      uVar9 = var.mir_op._8_8_;
      var.mir_op.u.i = uVar10;
      uVar16 = val.mir_op._10_6_;
      uVar14 = val.mir_op.u.i._1_7_;
      val.mir_op._8_8_ = uVar12;
      uVar10 = val.mir_op._8_8_;
      val.mir_op.u.i = uVar13;
      uVar12 = var.mir_op.u.i;
      var.mir_op._10_6_ = uVar15;
      var.mir_op.u.mem.alias = uVar11;
      uVar13 = val.mir_op.u.i;
      val.mir_op._10_6_ = uVar16;
      val.mir_op.u.i._1_7_ = uVar14;
      memcpy(&var,&local_b8,0x40);
      uVar13 = val.mir_op.u.i;
      uVar12 = val.mir_op._8_8_;
      uVar10 = var.mir_op.u.i;
      uVar9 = var.mir_op._8_8_;
      var.mir_op.u.i = uVar10;
      val.mir_op.u.i = uVar13;
      var.mir_op._8_8_ = uVar9;
      val.mir_op._8_8_ = uVar12;
      if ((uVar9 & 0xff) != 1) {
        uVar15 = var.mir_op._10_6_;
        uVar11 = var.mir_op.u.mem.alias;
        uVar9 = var.mir_op._8_8_;
        uVar16 = val.mir_op._10_6_;
        uVar14 = val.mir_op.u.i._1_7_;
        uVar10 = val.mir_op._8_8_;
        uVar12 = var.mir_op.u.i;
        var.mir_op._10_6_ = uVar15;
        var.mir_op.u.mem.alias = uVar11;
        uVar13 = val.mir_op.u.i;
        val.mir_op._10_6_ = uVar16;
        val.mir_op.u.i._1_7_ = uVar14;
        __assert_fail("var.mir_op.mode == MIR_OP_REG",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2b27,"void block_move(c2m_ctx_t, op_t, op_t, mir_size_t)");
      }
      auVar7._16_8_ = val.mir_op.data;
      auVar7._0_16_ = (undefined1  [16])val._0_16_;
      auVar7._24_8_ = uVar12;
      auVar7._26_6_ = val.mir_op._10_6_;
      auVar7._32_8_ = uVar13;
      auVar7._33_7_ = val.mir_op.u.i._1_7_;
      auVar7._40_8_ = val.mir_op.u.str.s;
      auVar7._48_8_ = val.mir_op.u._16_8_;
      auVar7._56_8_ = val.mir_op.u.mem.disp;
      auVar20 = vmovdqu64_avx512f(auVar7);
      oVar1 = (op_t)vmovdqu64_avx512f(auVar20);
      uVar15 = var.mir_op._10_6_;
      uVar11 = var.mir_op.u.mem.alias;
      uVar9 = var.mir_op._8_8_;
      uVar16 = val.mir_op._10_6_;
      uVar14 = val.mir_op.u.i._1_7_;
      uVar12 = val.mir_op._8_8_;
      var.mir_op._10_6_ = uVar15;
      var.mir_op.u.mem.alias = uVar11;
      uVar13 = val.mir_op.u.i;
      val.mir_op._10_6_ = uVar16;
      val.mir_op.u.i._1_7_ = uVar14;
      gen_memcpy(c2m_ctx,0,(MIR_reg_t)uVar10,oVar1,size);
    }
  }
  return;
}

Assistant:

static void block_move (c2m_ctx_t c2m_ctx, op_t var, op_t val, mir_size_t size) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_label_t repeat_label;
  op_t index;

  if (MIR_op_eq_p (ctx, var.mir_op, val.mir_op) || size == 0) return;
  if (size > 5) {
    var = mem_to_address (c2m_ctx, var, TRUE);
    assert (var.mir_op.mode == MIR_OP_REG);
    gen_memcpy (c2m_ctx, 0, var.mir_op.u.reg, val, size);
  } else {
    repeat_label = MIR_new_label (ctx);
    index = get_new_temp (c2m_ctx, MIR_T_I64);
    emit2 (c2m_ctx, MIR_MOV, index.mir_op, MIR_new_int_op (ctx, size));
    val = modify_for_block_move (c2m_ctx, val, index);
    var = modify_for_block_move (c2m_ctx, var, index);
    emit_label_insn_opt (c2m_ctx, repeat_label);
    emit3 (c2m_ctx, MIR_SUB, index.mir_op, index.mir_op, one_op.mir_op);
    assert (var.mir_op.mode == MIR_OP_MEM && val.mir_op.mode == MIR_OP_MEM);
    val.mir_op.u.mem.type = var.mir_op.u.mem.type = MIR_T_I8;
    emit2 (c2m_ctx, MIR_MOV, var.mir_op, val.mir_op);
    emit3 (c2m_ctx, MIR_BGT, MIR_new_label_op (ctx, repeat_label), index.mir_op, zero_op.mir_op);
  }
}